

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReach.c
# Opt level: O1

DdNode * Abc_NtkInitStateVarMap(DdManager *dd,Abc_Ntk_t *pNtk,int fVerbose)

{
  void *pvVar1;
  DdNode **ppDVar2;
  DdNode **x;
  DdNode **y;
  Vec_Ptr_t *pVVar3;
  DdNode *pDVar4;
  size_t __size;
  DdNode *f;
  long lVar5;
  
  __size = (long)dd->size << 3;
  x = (DdNode **)malloc(__size);
  y = (DdNode **)malloc(__size);
  pDVar4 = dd->one;
  Cudd_Ref(pDVar4);
  pVVar3 = pNtk->vBoxes;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    f = pDVar4;
    do {
      pvVar1 = pVVar3->pArray[lVar5];
      pDVar4 = f;
      if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 8) {
        ppDVar2 = dd->vars;
        pDVar4 = ppDVar2[pNtk->vPis->nSize + lVar5];
        x[lVar5] = pDVar4;
        y[lVar5] = ppDVar2[pNtk->vCis->nSize + lVar5];
        if ((*(uint *)((long)pvVar1 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(pLatch)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x1a8,"int Abc_LatchIsInit1(Abc_Obj_t *)");
        }
        pDVar4 = Cudd_bddAnd(dd,f,(DdNode *)
                                  ((ulong)(*(long *)((long)pvVar1 + 0x38) != 2) ^ (ulong)pDVar4));
        Cudd_Ref(pDVar4);
        Cudd_RecursiveDeref(dd,f);
      }
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vBoxes;
      f = pDVar4;
    } while (lVar5 < pVVar3->nSize);
  }
  Cudd_SetVarMap(dd,x,y,pNtk->nObjCounts[8]);
  if (x != (DdNode **)0x0) {
    free(x);
  }
  if (y != (DdNode **)0x0) {
    free(y);
  }
  Cudd_Deref(pDVar4);
  return pDVar4;
}

Assistant:

DdNode * Abc_NtkInitStateVarMap( DdManager * dd, Abc_Ntk_t * pNtk, int fVerbose )
{
    DdNode ** pbVarsX, ** pbVarsY;
    DdNode * bTemp, * bProd, * bVar;
    Abc_Obj_t * pLatch;
    int i;

    // set the variable mapping for Cudd_bddVarMap()
    pbVarsX = ABC_ALLOC( DdNode *, dd->size );
    pbVarsY = ABC_ALLOC( DdNode *, dd->size );
    bProd = b1;         Cudd_Ref( bProd );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        pbVarsX[i] = dd->vars[ Abc_NtkPiNum(pNtk) + i ];
        pbVarsY[i] = dd->vars[ Abc_NtkCiNum(pNtk) + i ];
        // get the initial value of the latch
        bVar  = Cudd_NotCond( pbVarsX[i], !Abc_LatchIsInit1(pLatch) );
        bProd = Cudd_bddAnd( dd, bTemp = bProd, bVar );      Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bTemp ); 
    }
    Cudd_SetVarMap( dd, pbVarsX, pbVarsY, Abc_NtkLatchNum(pNtk) );
    ABC_FREE( pbVarsX );
    ABC_FREE( pbVarsY );

    Cudd_Deref( bProd );
    return bProd;
}